

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

quaternion dja::operator*(quaternion *a,quaternion *b)

{
  float a_00;
  float_t b_00;
  quaternion qVar1;
  vec3 *b_01;
  vec3 *a_01;
  float_t fVar2;
  vec3 vVar3;
  vec3 vVar4;
  vec3 vVar5;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  a_00 = a->re;
  b_00 = b->re;
  a_01 = &a->im;
  b_01 = &b->im;
  fVar2 = dot(a_01,b_01);
  vVar3 = operator*(a_00,b_01);
  vVar4 = operator*(a_01,b_00);
  vVar5 = cross(a_01,b_01);
  local_28 = vVar4.x;
  fStack_24 = vVar4.y;
  local_38 = vVar3.x;
  fStack_34 = vVar3.y;
  qVar1.im.y = fStack_24 + fStack_34 + vVar5.y;
  qVar1.im.x = local_28 + local_38 + vVar5.x;
  qVar1.re = a_00 * b_00 - fVar2;
  qVar1.im.z = vVar5.z + vVar4.z + vVar3.z;
  return qVar1;
}

Assistant:

Q OP*(const Q& a, const Q& b) {
    V1 re = a.re * b.re - dot(a.im, b.im);
    V3 im = a.re * b.im + a.im * b.re + cross(a.im, b.im);
    return Q(re, im);
}